

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_position_geometry.cpp
# Opt level: O0

unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
 __thiscall
geometrycentral::surface::VertexPositionGeometry::reinterpretTo
          (VertexPositionGeometry *this,SurfaceMesh *targetMesh)

{
  VertexPositionGeometry *in_RDI;
  SurfaceMesh *in_stack_00000008;
  VertexPositionGeometry *in_stack_00000010;
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  *newGeom;
  ParentMeshT *in_stack_000000d0;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *in_stack_000000d8;
  _Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false> this_00;
  
  this_00._M_head_impl = in_RDI;
  operator_new(0x1660);
  VertexPositionGeometry(in_stack_00000010,in_stack_00000008);
  ::std::
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,std::default_delete<geometrycentral::surface::VertexPositionGeometry>>
  ::unique_ptr<std::default_delete<geometrycentral::surface::VertexPositionGeometry>,void>
            ((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
              *)this_00._M_head_impl,in_RDI);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::reinterpretTo
            (in_stack_000000d8,in_stack_000000d0);
  ::std::
  unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ::operator->((unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
                *)0x2c3cc8);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator=
            ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
             this_00._M_head_impl,
             (MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)in_RDI);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::~MeshData
            ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
             this_00._M_head_impl);
  return (__uniq_ptr_data<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>,_true,_true>
          )(tuple<geometrycentral::surface::VertexPositionGeometry_*,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
            )this_00._M_head_impl;
}

Assistant:

std::unique_ptr<VertexPositionGeometry> VertexPositionGeometry::reinterpretTo(SurfaceMesh& targetMesh) {
  std::unique_ptr<VertexPositionGeometry> newGeom(new VertexPositionGeometry(targetMesh));
  newGeom->inputVertexPositions = inputVertexPositions.reinterpretTo(targetMesh);
  return newGeom;
}